

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

int ns_hexdump(void *buf,int len,char *dst,int dst_len)

{
  int iVar1;
  int iVar2;
  char cVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  char ascii [17];
  
  ascii[0] = '\0';
  ascii[1] = '\0';
  ascii[2] = '\0';
  ascii[3] = '\0';
  ascii[4] = '\0';
  ascii[5] = '\0';
  ascii[6] = '\0';
  ascii[7] = '\0';
  ascii[8] = '\0';
  ascii[9] = '\0';
  ascii[10] = '\0';
  ascii[0xb] = '\0';
  ascii[0xc] = '\0';
  ascii[0xd] = '\0';
  ascii[0xe] = '\0';
  ascii[0xf] = '\0';
  ascii[0x10] = '\0';
  iVar2 = 0;
  if (len < 1) {
    len = 0;
  }
  uVar6 = (ulong)(uint)len;
  bVar5 = -(char)len;
  for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
    if ((uVar4 & 0xf) == 0) {
      if (uVar4 != 0) {
        iVar1 = snprintf(dst + iVar2,(long)(dst_len - iVar2),"  %s\n",ascii);
        iVar2 = iVar1 + iVar2;
      }
      iVar1 = snprintf(dst + iVar2,(long)(dst_len - iVar2),"%04x ",uVar4 & 0xffffffff);
      iVar2 = iVar1 + iVar2;
    }
    iVar1 = snprintf(dst + iVar2,(long)(dst_len - iVar2)," %02x",(ulong)*(byte *)((long)buf + uVar4)
                    );
    iVar2 = iVar1 + iVar2;
    cVar3 = *(char *)((long)buf + uVar4);
    if ((byte)(cVar3 + 0x81U) < 0xa1) {
      cVar3 = '.';
    }
    ascii[(uint)uVar4 & 0xf] = cVar3;
    ascii[(uVar4 & 0xf) + 1] = '\0';
    bVar5 = bVar5 + 1;
  }
  while( true ) {
    if ((bVar5 & 0xf) == ((byte)uVar6 & 0xf)) break;
    uVar6 = (ulong)((int)uVar6 + 1);
    iVar1 = snprintf(dst + iVar2,(long)(dst_len - iVar2),"%s","   ");
    iVar2 = iVar1 + iVar2;
  }
  iVar1 = snprintf(dst + iVar2,(long)(dst_len - iVar2),"  %s\n\n",ascii);
  return iVar1 + iVar2;
}

Assistant:

int ns_hexdump(const void *buf, int len, char *dst, int dst_len) {
  const unsigned char *p = (const unsigned char *) buf;
  char ascii[17] = "";
  int i, idx, n = 0;

  for (i = 0; i < len; i++) {
    idx = i % 16;
    if (idx == 0) {
      if (i > 0) n += snprintf(dst + n, dst_len - n, "  %s\n", ascii);
      n += snprintf(dst + n, dst_len - n, "%04x ", i);
    }
    n += snprintf(dst + n, dst_len - n, " %02x", p[i]);
    ascii[idx] = p[i] < 0x20 || p[i] > 0x7e ? '.' : p[i];
    ascii[idx + 1] = '\0';
  }

  while (i++ % 16) n += snprintf(dst + n, dst_len - n, "%s", "   ");
  n += snprintf(dst + n, dst_len - n, "  %s\n\n", ascii);

  return n;
}